

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

ssize_t __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
          (arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
           *this,int __fd,void *__buf,size_t __n)

{
  basic_string_view<char> s;
  ssize_t extraout_RAX;
  ssize_t sVar1;
  size_t __n_00;
  char *s_00;
  undefined1 local_28 [8];
  string_view sv;
  bool value_local;
  arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
  *this_local;
  
  sv.size_._7_1_ = (byte)__fd & 1;
  __n_00 = CONCAT71((int7)(__n >> 8),(byte)__fd) & 0xffffffffffffff01;
  s_00 = "false";
  if ((__fd & 1U) != 0) {
    s_00 = "true";
  }
  basic_string_view<char>::basic_string_view((basic_string_view<char> *)local_28,s_00);
  if (this->specs_ == (format_specs *)0x0) {
    sVar1 = basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
                      (&this->writer_,local_28._0_4_,sv.data_,__n_00);
  }
  else {
    s.size_ = (size_t)sv.data_;
    s.data_ = (char *)local_28;
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write<char>
              (&this->writer_,s,this->specs_);
    sVar1 = extraout_RAX;
  }
  return sVar1;
}

Assistant:

void write(bool value) {
    string_view sv(value ? "true" : "false");
    specs_ ? writer_.write(sv, *specs_) : writer_.write(sv);
  }